

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodetxb.c
# Opt level: O0

void av1_txb_init_levels_c(tran_low_t *coeff,int width,int height,uint8_t *levels)

{
  int iVar1;
  undefined1 *in_RCX;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  int j_1;
  int j;
  int i;
  uint8_t *ls;
  int stride;
  int local_34;
  int local_30;
  int local_2c;
  undefined1 *local_28;
  
  memset(in_RCX + (in_EDX + 4) * in_ESI,0,(long)((in_EDX + 4) * 4 + 0x10));
  local_28 = in_RCX;
  for (local_2c = 0; local_2c < in_ESI; local_2c = local_2c + 1) {
    for (local_30 = 0; local_30 < in_EDX; local_30 = local_30 + 1) {
      iVar1 = *(int *)(in_RDI + (long)(local_2c * in_EDX + local_30) * 4);
      if (iVar1 < 1) {
        iVar1 = -iVar1;
      }
      iVar1 = clamp(iVar1,0,0x7f);
      *local_28 = (char)iVar1;
      local_28 = local_28 + 1;
    }
    for (local_34 = 0; local_34 < 4; local_34 = local_34 + 1) {
      *local_28 = 0;
      local_28 = local_28 + 1;
    }
  }
  return;
}

Assistant:

void av1_txb_init_levels_c(const tran_low_t *const coeff, const int width,
                           const int height, uint8_t *const levels) {
  const int stride = height + TX_PAD_HOR;
  uint8_t *ls = levels;

  memset(levels + stride * width, 0,
         sizeof(*levels) * (TX_PAD_BOTTOM * stride + TX_PAD_END));

  for (int i = 0; i < width; i++) {
    for (int j = 0; j < height; j++) {
      *ls++ = (uint8_t)clamp(abs(coeff[i * height + j]), 0, INT8_MAX);
    }
    for (int j = 0; j < TX_PAD_HOR; j++) {
      *ls++ = 0;
    }
  }
}